

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_iterator.h
# Opt level: O1

node_iterator_base<const_YAML::detail::node> * __thiscall
YAML::detail::node_iterator_base<const_YAML::detail::node>::operator++
          (node_iterator_base<const_YAML::detail::node> *this)

{
  pair<YAML::detail::node_*,_YAML::detail::node_*> *ppVar1;
  
  if (this->m_type == Map) {
    ppVar1 = (this->m_mapIt)._M_current + 1;
    (this->m_mapIt)._M_current = ppVar1;
    while (((this->m_mapEnd)._M_current != ppVar1 &&
           ((((((ppVar1->first->m_pRef).
                super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->m_isDefined != '\x01' ||
            (((((ppVar1->second->m_pRef).
                super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->m_isDefined == false))))) {
      ppVar1 = ppVar1 + 1;
    }
    (this->m_mapIt)._M_current = ppVar1;
    return this;
  }
  if (this->m_type == Sequence) {
    (this->m_seqIt)._M_current = (this->m_seqIt)._M_current + 1;
  }
  return this;
}

Assistant:

node_iterator_base<V>& operator++() {
    switch (m_type) {
      case iterator_type::NoneType:
        break;
      case iterator_type::Sequence:
        ++m_seqIt;
        break;
      case iterator_type::Map:
        ++m_mapIt;
        m_mapIt = increment_until_defined(m_mapIt);
        break;
    }
    return *this;
  }